

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O0

void __thiscall leveldb::test::Tester::~Tester(Tester *this)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  undefined8 uVar3;
  string local_30 [32];
  Tester *local_10;
  Tester *this_local;
  
  __stream = _stderr;
  local_10 = this;
  if ((this->ok_ & 1U) == 0) {
    pcVar2 = this->fname_;
    uVar1 = this->line_;
    std::__cxx11::stringstream::str();
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s:%d:%s\n",pcVar2,(ulong)uVar1,uVar3);
    std::__cxx11::string::~string(local_30);
    exit(1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->ss_);
  return;
}

Assistant:

~Tester() {
    if (!ok_) {
      fprintf(stderr, "%s:%d:%s\n", fname_, line_, ss_.str().c_str());
      exit(1);
    }
  }